

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O3

void __thiscall
AbstractWrittenFont::AppendGlyphs
          (AbstractWrittenFont *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters,bool *outEncodingIsMultiByte,
          ObjectIDType *outFontObjectID)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  WrittenFontRepresentation *pWVar4;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType OVar5;
  AbstractWrittenFont *this_01;
  
  this_01 = this;
  if (this->mCIDRepresentation == (WrittenFontRepresentation *)0x0) {
LAB_001f8238:
    if (this->mANSIRepresentation != (WrittenFontRepresentation *)0x0) {
      bVar2 = CanEncodeWithIncludedChars
                        (this_01,this->mANSIRepresentation,inGlyphsList,outEncodedCharacters);
      if (!bVar2) goto LAB_001f825a;
      OVar5 = this->mANSIRepresentation->mWrittenObjectID;
LAB_001f82d5:
      bVar2 = false;
      goto LAB_001f8321;
    }
LAB_001f825a:
    if (this->mCIDRepresentation == (WrittenFontRepresentation *)0x0) {
      if (this->mANSIRepresentation == (WrittenFontRepresentation *)0x0) {
        pWVar4 = (WrittenFontRepresentation *)operator_new(0x38);
        p_Var1 = &(pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
        (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pWVar4->mWrittenObjectID = 0;
        this->mANSIRepresentation = pWVar4;
      }
      iVar3 = (*(this->super_IWrittenFont)._vptr_IWrittenFont[8])
                        (this,inGlyphsList,outEncodedCharacters);
      if ((char)iVar3 != '\0') {
        OVar5 = this->mANSIRepresentation->mWrittenObjectID;
        if (OVar5 == 0) {
          this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          OVar5 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
          this->mANSIRepresentation->mWrittenObjectID = OVar5;
        }
        goto LAB_001f82d5;
      }
      pWVar4 = (WrittenFontRepresentation *)operator_new(0x38);
      p_Var1 = &(pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
      (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (pWVar4->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pWVar4->mWrittenObjectID = 0;
      this->mCIDRepresentation = pWVar4;
    }
    AddToCIDRepresentation(this,inGlyphsList,outEncodedCharacters);
  }
  else {
    bVar2 = CanEncodeWithIncludedChars
                      (this,this->mCIDRepresentation,inGlyphsList,outEncodedCharacters);
    if (!bVar2) goto LAB_001f8238;
  }
  OVar5 = this->mCIDRepresentation->mWrittenObjectID;
  bVar2 = true;
LAB_001f8321:
  *outFontObjectID = OVar5;
  *outEncodingIsMultiByte = bVar2;
  return;
}

Assistant:

void AbstractWrittenFont::AppendGlyphs(	const GlyphUnicodeMappingListList& inGlyphsList,
										UShortListList& outEncodedCharacters,
										bool& outEncodingIsMultiByte,
										ObjectIDType &outFontObjectID)
{
	// same as the regular one, but with lists of strings

	if(mCIDRepresentation && CanEncodeWithIncludedChars(mCIDRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(mANSIRepresentation && CanEncodeWithIncludedChars(mANSIRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;
	}

	if(mCIDRepresentation)
	{
		AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(!mANSIRepresentation)
		mANSIRepresentation = new WrittenFontRepresentation();

	if(AddToANSIRepresentation(inGlyphsList,outEncodedCharacters))
	{
		if(0 == mANSIRepresentation->mWrittenObjectID)
			mANSIRepresentation->mWrittenObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;			
	}

	mCIDRepresentation = new WrittenFontRepresentation();
	AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
	outFontObjectID = mCIDRepresentation->mWrittenObjectID;
	outEncodingIsMultiByte = true;
}